

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestCompressionNoBias8(void)

{
  ostream *poVar1;
  Counter<unsigned_char,_8U> local_149;
  Counter<unsigned_long,_64U> local_148;
  Counter<unsigned_long,_64U> local_140;
  Counter64 ref_reconstructed;
  Counter<unsigned_long,_64U> local_130;
  Counter<unsigned_long,_64U> local_128;
  Counter64 reconstructed;
  Counter8 smaller;
  Counter64 recent;
  int64_t neighbor;
  int64_t offset;
  int64_t base;
  Counter<unsigned_long,_64U> local_f0;
  char local_e1;
  undefined1 *puStack_e0;
  int8_t gap;
  Counter<unsigned_long,_64U> *local_d8;
  Counter<unsigned_long,_64U> *local_d0;
  Counter<unsigned_long,_64U> local_c8;
  ulong local_c0;
  unsigned_long absDiff_1;
  ulong local_b0;
  unsigned_long absDiff;
  unsigned_long recentLow;
  Counter<unsigned_char,_8U> *local_98;
  Counter<unsigned_long,_64U> *local_90;
  Counter<unsigned_long,_64U> *local_88;
  ThisType *result;
  Counter<unsigned_long,_64U> *local_78;
  Counter<unsigned_long,_64U> *local_70;
  Counter<unsigned_long,_64U> *local_68;
  Counter<unsigned_long,_64U> *local_60;
  Counter<unsigned_long,_64U> *local_58;
  Counter<unsigned_long,_64U> *local_50;
  Counter<unsigned_char,_8U> *local_48;
  Counter<unsigned_char,_8U> *local_40;
  Counter<unsigned_char,_8U> *local_38;
  Counter<unsigned_char,_8U> *local_30;
  unsigned_long *local_28;
  Counter<unsigned_long,_64U> *local_20;
  Counter<unsigned_long,_64U> *local_18;
  Counter<unsigned_long,_64U> *local_10;
  
  offset = 0;
  do {
    if (0x200 < offset) {
      return true;
    }
    for (neighbor = -0x101; neighbor < 0x101; neighbor = neighbor + 1) {
      if (-1 < offset + neighbor) {
        Counter<unsigned_long,_64U>::Counter
                  ((Counter<unsigned_long,_64U> *)&stack0xfffffffffffffee8,offset);
        Counter<unsigned_char,_8U>::Counter
                  ((Counter<unsigned_char,_8U> *)((long)&reconstructed.Value + 7),
                   (uchar)(offset + neighbor));
        Counter<unsigned_long,_64U>::Counter(&local_130,(ThisType *)&stack0xfffffffffffffee8);
        Counter<unsigned_char,_8U>::Counter
                  ((Counter<unsigned_char,_8U> *)((long)&ref_reconstructed.Value + 7),
                   (ThisType *)((long)&reconstructed.Value + 7));
        local_d0 = &local_128;
        local_d8 = &local_130;
        puStack_e0 = (undefined1 *)((long)&ref_reconstructed.Value + 7);
        local_e1 = ref_reconstructed.Value._7_1_ - (char)local_130.Value;
        Counter<unsigned_long,_64U>::Counter(&local_f0,(long)local_e1);
        local_50 = &local_128;
        local_58 = &local_130;
        local_60 = &local_f0;
        Counter<unsigned_long,_64U>::Counter(&local_128,local_130.Value + local_f0.Value);
        Counter<unsigned_long,_64U>::Counter(&local_148,(ThisType *)&stack0xfffffffffffffee8);
        Counter<unsigned_char,_8U>::Counter(&local_149,(ThisType *)((long)&reconstructed.Value + 7))
        ;
        local_88 = &local_140;
        local_90 = &local_148;
        local_98 = &local_149;
        recentLow = 0;
        local_30 = &local_149;
        local_78 = &local_148;
        Counter<unsigned_long,_64U>::Counter
                  (&local_140,(ulong)local_149.Value | local_148.Value & 0xffffffffffffff00);
        result = &local_148;
        absDiff = local_148.Value & 0xff;
        local_38 = &local_149;
        if (absDiff < local_149.Value) {
          local_48 = &local_149;
          local_b0 = local_149.Value - absDiff;
          if (0x80 - recentLow <= local_b0) {
            Counter<unsigned_long,_64U>::Counter((Counter<unsigned_long,_64U> *)&absDiff_1,0x100);
            local_20 = &local_140;
            local_28 = &absDiff_1;
            local_140.Value = local_140.Value - absDiff_1;
          }
        }
        else {
          local_40 = &local_149;
          local_c0 = absDiff - local_149.Value;
          if (recentLow + 0x80 < local_c0) {
            Counter<unsigned_long,_64U>::Counter(&local_c8,0x100);
            local_10 = &local_140;
            local_18 = &local_c8;
            local_140.Value = local_140.Value + local_c8.Value;
          }
        }
        local_68 = &local_128;
        local_70 = &local_140;
        if (local_128.Value != local_140.Value) {
          poVar1 = std::operator<<((ostream *)&std::cout,
                                   "!! TestCompressionNoBias8 failed: New algorithm does not match reference version for base = "
                                  );
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,offset);
          poVar1 = std::operator<<(poVar1,", offset = ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,neighbor);
          std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
          return false;
        }
      }
    }
    offset = offset + 1;
  } while( true );
}

Assistant:

bool TestCompressionNoBias8()
{
    for (int64_t base = 0; base < 256 * 2 + 1; ++base)
    {
        for (int64_t offset = -256 - 1; offset < 256 + 1; ++offset)
        {
            const int64_t neighbor = base + offset;
            if (neighbor < 0) {
                continue;
            }

            Counter64 recent = base;
            Counter8 smaller = (uint8_t)neighbor;
            Counter64 reconstructed = Counter64::ExpandFromTruncated(recent, smaller);

            // Compare with reference version
            Counter64 ref_reconstructed = Counter64::ExpandFromTruncatedWithBias(recent, smaller, 0);

            if (reconstructed.ToUnsigned() != ref_reconstructed.ToUnsigned())
            {
                std::cout << "!! TestCompressionNoBias8 failed: New algorithm does not match reference version for base = " << base << ", offset = " << offset << std::endl;

                COUNTER_DEBUG_BREAK();
                return false;
            }
        }
    }

    return true;
}